

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O1

int32_t u_parseCodePointRange(char *s,uint32_t *pStart,uint32_t *pEnd,UErrorCode *pErrorCode)

{
  byte bVar1;
  int32_t iVar2;
  char *terminator;
  byte *local_10;
  
  iVar2 = u_parseCodePointRangeAnyTerminator(s,pStart,pEnd,(char **)&local_10,pErrorCode);
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    while( true ) {
      bVar1 = *local_10;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
      local_10 = local_10 + 1;
    }
    if ((bVar1 != 0) && (bVar1 != 0x3b)) {
      *pErrorCode = U_PARSE_ERROR;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseCodePointRange(const char *s,
                      uint32_t *pStart, uint32_t *pEnd,
                      UErrorCode *pErrorCode) {
    const char *terminator;
    int32_t rangeLength=
        u_parseCodePointRangeAnyTerminator(s, pStart, pEnd, &terminator, pErrorCode);
    if(U_SUCCESS(*pErrorCode)) {
        terminator=u_skipWhitespace(terminator);
        if(*terminator!=';' && *terminator!=0) {
            *pErrorCode=U_PARSE_ERROR;
            return 0;
        }
    }
    return rangeLength;
}